

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::entry_point_args_builtin(CompilerMSL *this,string *ep_args)

{
  _func_void *p_Var1;
  ID id;
  size_t sVar2;
  Variant *pVVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  char cVar5;
  bool bVar6;
  char cVar7;
  BuiltIn bi_type;
  uint32_t uVar8;
  uint uVar9;
  ExecutionModel EVar10;
  IndexType IVar11;
  SPIRVariable *pSVar12;
  SPIRType *pSVar13;
  long *plVar14;
  undefined8 *puVar15;
  _Node_iterator_base<unsigned_int,_false> _Var16;
  SPIREntryPoint *pSVar17;
  const_iterator cVar18;
  SPIRConstant *pSVar19;
  SPIRFunction *pSVar20;
  ulong uVar21;
  runtime_error *prVar22;
  size_type *psVar23;
  CompilerMSL *pCVar24;
  ulong *puVar25;
  undefined8 *puVar26;
  uint32_t *puVar27;
  uint uVar28;
  long lVar29;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *ppVar30;
  undefined8 uVar31;
  string *in_R8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *var;
  pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *ppVar33;
  char (*in_stack_fffffffffffffe68) [4];
  _Any_data local_190;
  undefined1 local_180 [24];
  pointer local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  string __str;
  uint32_t outer_factor_initializer_id;
  char acStack_124 [4];
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  uint32_t inner_factor_initializer_id;
  char acStack_104 [4];
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  LoopLock local_e8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_e0;
  ParsedIR *local_d8;
  TypedID<(spirv_cross::Types)0> *local_d0;
  SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL> active_builtins;
  
  active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.ptr =
       (pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *)&active_builtins.stack_storage;
  active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
  buffer_size = 0;
  active_builtins.buffer_capacity = 8;
  local_d8 = &(this->super_CompilerGLSL).super_Compiler.ir;
  ParsedIR::create_loop_hard_lock(local_d8);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    local_d0 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_e0 = &(this->super_CompilerGLSL).super_Compiler.active_input_builtins.higher._M_h;
    lVar29 = 0;
    do {
      id.id = *(uint32_t *)((long)&local_d0->id + lVar29);
      pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if ((pVVar3[id.id].type == TypeVariable) &&
         (pSVar12 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + id.id),
         pSVar12->storage == StorageClassInput)) {
        bi_type = Compiler::get_decoration((Compiler *)this,id,DecorationBuiltIn);
        bVar6 = Compiler::is_builtin_variable((Compiler *)this,pSVar12);
        if ((bVar6) &&
           ((pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12),
            *(int *)&(pSVar13->super_IVariant).field_0xc != 0xf &&
            (pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12),
            *(int *)&(pSVar13->super_IVariant).field_0xc != 0x15)))) {
          local_190._0_4_ = bi_type;
          if (bi_type < 0x40) {
            _Var16._M_cur =
                 (__node_type *)
                 ((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower >>
                  ((ulong)bi_type & 0x3f) & 1);
          }
          else {
            _Var16._M_cur =
                 (__node_type *)
                 ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(local_e0,(key_type *)local_190._M_pod_data);
          }
          if ((_Var16._M_cur == (__node_type *)0x0) ||
             (bVar6 = Compiler::interface_variable_exists_in_entry_point((Compiler *)this,id.id),
             !bVar6)) goto LAB_002dd38d;
          SmallVector<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>,_8UL>::reserve
                    (&active_builtins,
                     active_builtins.
                     super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
                     buffer_size + 1);
          active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
          ptr[active_builtins.
              super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.buffer_size].
          first = pSVar12;
          active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
          ptr[active_builtins.
              super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.buffer_size].
          second = bi_type;
          active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
          buffer_size = active_builtins.
                        super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
                        buffer_size + 1;
          bVar6 = is_direct_input_builtin(this,bi_type);
          if (!bVar6) goto LAB_002dce9a;
          if (ep_args->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)ep_args);
          }
          this->builtin_declaration = true;
          if ((bi_type == BuiltInTessCoord) &&
             (pSVar17 = Compiler::get_entry_point((Compiler *)this),
             ((pSVar17->flags).lower & 0x1000000) != 0)) {
            CompilerGLSL::to_expression_abi_cxx11_(&__str,&this->super_CompilerGLSL,id.id,true);
            puVar15 = (undefined8 *)
                      ::std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x3799f7);
            local_180._16_8_ = &local_160;
            puVar25 = puVar15 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar25) {
              local_160._M_allocated_capacity = *puVar25;
              local_160._8_8_ = puVar15[3];
            }
            else {
              local_160._M_allocated_capacity = *puVar25;
              local_180._16_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar15;
            }
            local_168 = (pointer)puVar15[1];
            *puVar15 = puVar25;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            puVar15 = (undefined8 *)::std::__cxx11::string::append(local_180 + 0x10);
            local_190._M_unused._M_object = local_180;
            puVar26 = puVar15 + 2;
            if ((undefined8 *)*puVar15 == puVar26) {
              local_180._0_8_ = *puVar26;
              local_180._8_8_ = puVar15[3];
            }
            else {
              local_180._0_8_ = *puVar26;
              local_190._M_unused._M_object = (undefined8 *)*puVar15;
            }
            local_190._8_8_ = puVar15[1];
            *puVar15 = puVar26;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer)
            ;
            if ((undefined1 *)local_190._M_unused._0_8_ != local_180) {
              operator_delete(local_190._M_unused._M_object);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._16_8_ != &local_160) {
              operator_delete((void *)local_180._16_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) {
LAB_002dd70c:
              operator_delete(__str._M_dataplus._M_p);
            }
          }
          else {
            builtin_type_decl_abi_cxx11_(&__str,this,bi_type,id.id);
            puVar15 = (undefined8 *)::std::__cxx11::string::append((char *)&__str);
            local_180._16_8_ = &local_160;
            puVar25 = puVar15 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar15 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar25) {
              local_160._M_allocated_capacity = *puVar25;
              local_160._8_8_ = puVar15[3];
            }
            else {
              local_160._M_allocated_capacity = *puVar25;
              local_180._16_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar15;
            }
            local_168 = (pointer)puVar15[1];
            *puVar15 = puVar25;
            puVar15[1] = 0;
            *(undefined1 *)(puVar15 + 2) = 0;
            CompilerGLSL::to_expression_abi_cxx11_
                      ((string *)&outer_factor_initializer_id,&this->super_CompilerGLSL,id.id,true);
            uVar31 = (pointer)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._16_8_ != &local_160) {
              uVar31 = local_160._M_allocated_capacity;
            }
            if ((ulong)uVar31 < (pointer)(local_120 + (long)local_168)) {
              uVar31 = (pointer)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(acStack_124,outer_factor_initializer_id) != &local_118) {
                uVar31 = local_118._M_allocated_capacity;
              }
              if ((ulong)uVar31 < (pointer)(local_120 + (long)local_168)) goto LAB_002dd520;
              puVar15 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&outer_factor_initializer_id,0,(char *)0x0,
                                   local_180._16_8_);
            }
            else {
LAB_002dd520:
              puVar15 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  (local_180 + 0x10,
                                   CONCAT44(acStack_124,outer_factor_initializer_id));
            }
            local_190._M_unused._M_object = local_180;
            p_Var1 = (_func_void *)(puVar15 + 2);
            if ((_func_void *)*puVar15 == p_Var1) {
              local_180._0_8_ = *(undefined8 *)p_Var1;
              local_180._8_8_ = puVar15[3];
            }
            else {
              local_180._0_8_ = *(undefined8 *)p_Var1;
              local_190._M_unused._M_object = (_func_void *)*puVar15;
            }
            local_190._8_8_ = puVar15[1];
            *puVar15 = p_Var1;
            puVar15[1] = 0;
            *p_Var1 = (_func_void)0x0;
            ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer)
            ;
            if ((undefined1 *)local_190._M_unused._0_8_ != local_180) {
              operator_delete(local_190._M_unused._M_object);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(acStack_124,outer_factor_initializer_id) != &local_118) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(acStack_124,outer_factor_initializer_id));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._16_8_ != &local_160) {
              operator_delete((void *)local_180._16_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)__str._M_dataplus._M_p != &__str.field_2) goto LAB_002dd70c;
          }
          builtin_qualifier_abi_cxx11_((string *)(local_180 + 0x10),this,bi_type);
          in_R8 = (string *)0x3;
          plVar14 = (long *)::std::__cxx11::string::replace
                                      ((ulong)(local_180 + 0x10),0,(char *)0x0,0x376f5d);
          local_190._M_unused._M_object = local_180;
          pCVar24 = (CompilerMSL *)(plVar14 + 2);
          if ((CompilerMSL *)*plVar14 == pCVar24) {
            local_180._0_8_ = (pCVar24->super_CompilerGLSL).super_Compiler._vptr_Compiler;
            local_180._8_8_ = plVar14[3];
          }
          else {
            local_180._0_8_ = (pCVar24->super_CompilerGLSL).super_Compiler._vptr_Compiler;
            local_190._M_unused._M_object = (CompilerMSL *)*plVar14;
          }
          local_190._8_8_ = plVar14[1];
          *plVar14 = (long)pCVar24;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
          if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
            operator_delete(local_190._M_unused._M_object);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._16_8_ != &local_160) {
            operator_delete((void *)local_180._16_8_);
          }
          if (bi_type == BuiltInSampleMask) {
            pSVar17 = Compiler::get_entry_point((Compiler *)this);
            local_190._0_4_ = 0x115e;
            cVar18 = ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(&(pSVar17->flags).higher._M_h,(key_type *)local_190._M_pod_data);
            if (cVar18.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0)
            {
              uVar9 = (this->msl_options).msl_version;
              if (uVar9 < 20000) {
                prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_190._M_unused._M_object = local_180;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_190,"Post-depth coverage requires MSL 2.0.","");
                ::std::runtime_error::runtime_error(prVar22,(string *)local_190._M_pod_data);
                *(undefined ***)prVar22 = &PTR__runtime_error_003f8e68;
                __cxa_throw(prVar22,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              if ((uVar9 < 0x4f4c) && ((this->msl_options).platform == macOS)) {
                prVar22 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_190._M_unused._M_object = local_180;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_190,"Post-depth coverage on Mac requires MSL 2.3.","");
                ::std::runtime_error::runtime_error(prVar22,(string *)local_190._M_pod_data);
                *(undefined ***)prVar22 = &PTR__runtime_error_003f8e68;
                __cxa_throw(prVar22,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
              ::std::__cxx11::string::append((char *)ep_args);
            }
          }
          ::std::__cxx11::string::append((char *)ep_args);
          this->builtin_declaration = false;
        }
LAB_002dce9a:
        bVar6 = Compiler::has_extended_decoration
                          ((Compiler *)this,id.id,SPIRVCrossDecorationBuiltInDispatchBase);
        if (bVar6) {
          if ((this->msl_options).msl_version < 0x27d8) {
            __assert_fail("msl_options.supports_msl_version(1, 2)",
                          "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                          ,0x316a,
                          "auto spirv_cross::CompilerMSL::entry_point_args_builtin(string &)::(anonymous class)::operator()(uint32_t, SPIRVariable &) const"
                         );
          }
          if (ep_args->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)ep_args);
          }
          pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&outer_factor_initializer_id,this,pSVar13,0);
          plVar14 = (long *)::std::__cxx11::string::append((char *)&outer_factor_initializer_id);
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          psVar23 = (size_type *)(plVar14 + 2);
          if ((size_type *)*plVar14 == psVar23) {
            __str.field_2._M_allocated_capacity = *psVar23;
            __str.field_2._8_8_ = plVar14[3];
          }
          else {
            __str.field_2._M_allocated_capacity = *psVar23;
            __str._M_dataplus._M_p = (pointer)*plVar14;
          }
          __str._M_string_length = plVar14[1];
          *plVar14 = (long)psVar23;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          CompilerGLSL::to_expression_abi_cxx11_
                    ((string *)&inner_factor_initializer_id,&this->super_CompilerGLSL,id.id,true);
          uVar31 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            uVar31 = __str.field_2._M_allocated_capacity;
          }
          in_R8 = (string *)__str._M_string_length;
          if ((ulong)uVar31 < local_100 + __str._M_string_length) {
            uVar31 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(acStack_104,inner_factor_initializer_id) != &local_f8) {
              uVar31 = local_f8._M_allocated_capacity;
            }
            if ((ulong)uVar31 < local_100 + __str._M_string_length) goto LAB_002dcfc7;
            puVar15 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&inner_factor_initializer_id,0,(char *)0x0,
                                 (ulong)__str._M_dataplus._M_p);
          }
          else {
LAB_002dcfc7:
            puVar15 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&__str,CONCAT44(acStack_104,inner_factor_initializer_id));
          }
          local_180._16_8_ = &local_160;
          puVar25 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar25) {
            local_160._M_allocated_capacity = *puVar25;
            local_160._8_8_ = puVar15[3];
          }
          else {
            local_160._M_allocated_capacity = *puVar25;
            local_180._16_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar15;
          }
          local_168 = (pointer)puVar15[1];
          *puVar15 = puVar25;
          puVar15[1] = 0;
          *(undefined1 *)puVar25 = 0;
          plVar14 = (long *)::std::__cxx11::string::append(local_180 + 0x10);
          local_190._M_unused._M_object = local_180;
          pCVar24 = (CompilerMSL *)(plVar14 + 2);
          if ((CompilerMSL *)*plVar14 == pCVar24) {
            local_180._0_8_ = (pCVar24->super_CompilerGLSL).super_Compiler._vptr_Compiler;
            local_180._8_8_ = plVar14[3];
          }
          else {
            local_180._0_8_ = (pCVar24->super_CompilerGLSL).super_Compiler._vptr_Compiler;
            local_190._M_unused._M_object = (CompilerMSL *)*plVar14;
          }
          local_190._8_8_ = plVar14[1];
          *plVar14 = (long)pCVar24;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
          if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
            operator_delete(local_190._M_unused._M_object);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._16_8_ != &local_160) {
            operator_delete((void *)local_180._16_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(acStack_104,inner_factor_initializer_id) != &local_f8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(acStack_104,inner_factor_initializer_id));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(acStack_124,outer_factor_initializer_id) != &local_118) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(acStack_124,outer_factor_initializer_id));
          }
        }
        bVar6 = Compiler::has_extended_decoration
                          ((Compiler *)this,id.id,SPIRVCrossDecorationBuiltInStageInputSize);
        if (bVar6) {
          if ((this->msl_options).msl_version < 0x27d8) {
            __assert_fail("msl_options.supports_msl_version(1, 2)",
                          "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                          ,0x3176,
                          "auto spirv_cross::CompilerMSL::entry_point_args_builtin(string &)::(anonymous class)::operator()(uint32_t, SPIRVariable &) const"
                         );
          }
          if (ep_args->_M_string_length != 0) {
            ::std::__cxx11::string::append((char *)ep_args);
          }
          pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&outer_factor_initializer_id,this,pSVar13,0);
          plVar14 = (long *)::std::__cxx11::string::append((char *)&outer_factor_initializer_id);
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          psVar23 = (size_type *)(plVar14 + 2);
          if ((size_type *)*plVar14 == psVar23) {
            __str.field_2._M_allocated_capacity = *psVar23;
            __str.field_2._8_8_ = plVar14[3];
          }
          else {
            __str.field_2._M_allocated_capacity = *psVar23;
            __str._M_dataplus._M_p = (pointer)*plVar14;
          }
          __str._M_string_length = plVar14[1];
          *plVar14 = (long)psVar23;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          CompilerGLSL::to_expression_abi_cxx11_
                    ((string *)&inner_factor_initializer_id,&this->super_CompilerGLSL,id.id,true);
          uVar31 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            uVar31 = __str.field_2._M_allocated_capacity;
          }
          in_R8 = (string *)__str._M_string_length;
          if ((ulong)uVar31 < local_100 + __str._M_string_length) {
            uVar31 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(acStack_104,inner_factor_initializer_id) != &local_f8) {
              uVar31 = local_f8._M_allocated_capacity;
            }
            if ((ulong)uVar31 < local_100 + __str._M_string_length) goto LAB_002dd259;
            puVar15 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&inner_factor_initializer_id,0,(char *)0x0,
                                 (ulong)__str._M_dataplus._M_p);
          }
          else {
LAB_002dd259:
            puVar15 = (undefined8 *)
                      ::std::__cxx11::string::_M_append
                                ((char *)&__str,CONCAT44(acStack_104,inner_factor_initializer_id));
          }
          local_180._16_8_ = &local_160;
          puVar25 = puVar15 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar15 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar25) {
            local_160._M_allocated_capacity = *puVar25;
            local_160._8_8_ = puVar15[3];
          }
          else {
            local_160._M_allocated_capacity = *puVar25;
            local_180._16_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar15;
          }
          local_168 = (pointer)puVar15[1];
          *puVar15 = puVar25;
          puVar15[1] = 0;
          *(undefined1 *)puVar25 = 0;
          plVar14 = (long *)::std::__cxx11::string::append(local_180 + 0x10);
          local_190._M_unused._M_object = local_180;
          pCVar24 = (CompilerMSL *)(plVar14 + 2);
          if ((CompilerMSL *)*plVar14 == pCVar24) {
            local_180._0_8_ = (pCVar24->super_CompilerGLSL).super_Compiler._vptr_Compiler;
            local_180._8_8_ = plVar14[3];
          }
          else {
            local_180._0_8_ = (pCVar24->super_CompilerGLSL).super_Compiler._vptr_Compiler;
            local_190._M_unused._M_object = (CompilerMSL *)*plVar14;
          }
          local_190._8_8_ = plVar14[1];
          *plVar14 = (long)pCVar24;
          plVar14[1] = 0;
          *(undefined1 *)(plVar14 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
          if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
            operator_delete(local_190._M_unused._M_object);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._16_8_ != &local_160) {
            operator_delete((void *)local_180._16_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(acStack_104,inner_factor_initializer_id) != &local_f8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(acStack_104,inner_factor_initializer_id));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(acStack_124,outer_factor_initializer_id) != &local_118) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(acStack_124,outer_factor_initializer_id));
          }
        }
      }
LAB_002dd38d:
      lVar29 = lVar29 + 4;
    } while (sVar2 << 2 != lVar29);
  }
  ParsedIR::LoopLock::~LoopLock(&local_e8);
  if (active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
      buffer_size != 0) {
    ppVar30 = active_builtins.
              super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.ptr +
              active_builtins.
              super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.buffer_size;
    ppVar33 = active_builtins.
              super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.ptr;
    do {
      uVar8 = ensure_correct_builtin_type
                        (this,*(uint32_t *)&(ppVar33->first->super_IVariant).field_0xc,
                         ppVar33->second);
      *(uint32_t *)&(ppVar33->first->super_IVariant).field_0xc = uVar8;
      ppVar33 = ppVar33 + 1;
    } while (ppVar33 != ppVar30);
  }
  if (this->needs_base_vertex_arg == Yes) {
    built_in_func_arg_abi_cxx11_
              ((string *)&local_190,this,BuiltInBaseVertex,ep_args->_M_string_length != 0);
    ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
    if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
      operator_delete(local_190._M_unused._M_object);
    }
  }
  if (this->needs_base_instance_arg == Yes) {
    built_in_func_arg_abi_cxx11_
              ((string *)&local_190,this,BuiltInBaseInstance,ep_args->_M_string_length != 0);
    ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
    if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
      operator_delete(local_190._M_unused._M_object);
    }
  }
  if (this->capture_output_to_buffer != true) goto LAB_002de3d4;
  uVar9 = (this->stage_out_var_id).id;
  if (uVar9 != 0) {
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
      uVar9 = (this->stage_out_var_id).id;
    }
    pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + uVar9);
    pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
              (local_180 + 0x10,this,pSVar13,0);
    in_R8 = &this->output_buffer_var_name;
    join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],unsigned_int&,char_const(&)[4]>
              ((string *)&local_190,(spirv_cross *)0x377242,(char (*) [8])(local_180 + 0x10),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x360c1e,
               (char (*) [3])in_R8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3771ea,
               (char (*) [11])&(this->msl_options).shader_output_buffer_index,(uint *)")]]",
               in_stack_fffffffffffffe68);
    ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
    if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
      operator_delete(local_190._M_unused._M_object);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._16_8_ != &local_160) {
      operator_delete((void *)local_180._16_8_);
    }
  }
  EVar10 = Compiler::get_execution_model((Compiler *)this);
  if (EVar10 == ExecutionModelTessellationControl) {
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
    }
    join<char_const(&)[43],unsigned_int&,char_const(&)[4]>
              ((string *)&local_190,(spirv_cross *)"constant uint* spvIndirectParams [[buffer(",
               (char (*) [43])&(this->msl_options).indirect_params_buffer_index,(uint *)")]]",
               (char (*) [4])in_R8);
    ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
    if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
LAB_002ddaea:
      operator_delete(local_190._M_unused._M_object);
    }
  }
  else if (((this->stage_out_var_id).id != 0) &&
          ((EVar10 = Compiler::get_execution_model((Compiler *)this), EVar10 != ExecutionModelVertex
           || ((this->msl_options).vertex_for_tessellation == false)))) {
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
    }
    join<char_const(&)[41],unsigned_int&,char_const(&)[4]>
              ((string *)&local_190,(spirv_cross *)"device uint* spvIndirectParams [[buffer(",
               (char (*) [41])&(this->msl_options).indirect_params_buffer_index,(uint *)")]]",
               (char (*) [4])in_R8);
    ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
    if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) goto LAB_002ddaea;
  }
  EVar10 = Compiler::get_execution_model((Compiler *)this);
  if ((((EVar10 == ExecutionModelVertex) && ((this->msl_options).vertex_for_tessellation == true))
      && (((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower & 0x40000000020) !=
          0)) && (IVar11 = (this->msl_options).vertex_index_type, IVar11 != None)) {
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
      IVar11 = (this->msl_options).vertex_index_type;
    }
    if (IVar11 == UInt32) {
      join<char_const(&)[20],std::__cxx11::string&,char_const(&)[11],unsigned_int&,char_const(&)[4]>
                ((string *)&local_190,(spirv_cross *)"const device uint* ",
                 (char (*) [20])&this->index_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3771ea,
                 (char (*) [11])&(this->msl_options).shader_index_buffer_index,(uint *)")]]",
                 in_stack_fffffffffffffe68);
      ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
      if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
LAB_002ddbfb:
        operator_delete(local_190._M_unused._M_object);
      }
    }
    else if (IVar11 == UInt16) {
      join<char_const(&)[22],std::__cxx11::string&,char_const(&)[11],unsigned_int&,char_const(&)[4]>
                ((string *)&local_190,(spirv_cross *)"const device ushort* ",
                 (char (*) [22])&this->index_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3771ea,
                 (char (*) [11])&(this->msl_options).shader_index_buffer_index,(uint *)")]]",
                 in_stack_fffffffffffffe68);
      ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
      if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) goto LAB_002ddbfb;
    }
  }
  EVar10 = Compiler::get_execution_model((Compiler *)this);
  if (EVar10 == ExecutionModelTessellationControl) {
    uVar9 = (this->patch_stage_out_var_id).id;
    if (uVar9 != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
        uVar9 = (this->patch_stage_out_var_id).id;
      }
      pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar9);
      pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_180 + 0x10,this,pSVar13,0);
      uVar9 = (this->msl_options).shader_patch_output_buffer_index;
      cVar7 = '\x01';
      if (9 < uVar9) {
        uVar28 = uVar9;
        cVar5 = '\x04';
        do {
          cVar7 = cVar5;
          if (uVar28 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_002ddcc8;
          }
          if (uVar28 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_002ddcc8;
          }
          if (uVar28 < 10000) goto LAB_002ddcc8;
          bVar6 = 99999 < uVar28;
          uVar28 = uVar28 / 10000;
          cVar5 = cVar7 + '\x04';
        } while (bVar6);
        cVar7 = cVar7 + '\x01';
      }
LAB_002ddcc8:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str,cVar7);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar9);
      join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((string *)&local_190,(spirv_cross *)0x377242,(char (*) [8])(local_180 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x360c1e,
                 (char (*) [3])&this->patch_output_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3771ea,
                 (char (*) [11])&__str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                 in_stack_fffffffffffffe68);
      ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
      if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
        operator_delete(local_190._M_unused._M_object);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._16_8_ != &local_160) {
        operator_delete((void *)local_180._16_8_);
      }
    }
    if (ep_args->_M_string_length != 0) {
      ::std::__cxx11::string::append((char *)ep_args);
    }
    get_tess_factor_struct_name_abi_cxx11_((string *)(local_180 + 0x10),this);
    uVar9 = (this->msl_options).shader_tess_factor_buffer_index;
    cVar7 = '\x01';
    if (9 < uVar9) {
      uVar28 = uVar9;
      cVar5 = '\x04';
      do {
        cVar7 = cVar5;
        if (uVar28 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_002dddeb;
        }
        if (uVar28 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_002dddeb;
        }
        if (uVar28 < 10000) goto LAB_002dddeb;
        bVar6 = 99999 < uVar28;
        uVar28 = uVar28 / 10000;
        cVar5 = cVar7 + '\x04';
      } while (bVar6);
      cVar7 = cVar7 + '\x01';
    }
LAB_002dddeb:
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    ::std::__cxx11::string::_M_construct((ulong)&__str,cVar7);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar9);
    join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
              ((string *)&local_190,(spirv_cross *)0x377242,(char (*) [8])(local_180 + 0x10),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x360c1e,
               (char (*) [3])&this->tess_factor_buffer_var_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3771ea,
               (char (*) [11])&__str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
               in_stack_fffffffffffffe68);
    ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
    if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
      operator_delete(local_190._M_unused._M_object);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._16_8_ != &local_160) {
      operator_delete((void *)local_180._16_8_);
    }
    outer_factor_initializer_id = 0;
    inner_factor_initializer_id = 0;
    ParsedIR::create_loop_hard_lock(local_d8);
    sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar2 == 0) {
      ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_190);
    }
    else {
      pTVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar29 = 0;
      do {
        uVar9 = *(uint *)((long)&pTVar4->id + lVar29);
        pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar3[uVar9].type == TypeVariable) {
          pSVar12 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar9);
          bVar6 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSVar12->super_IVariant).self.id,
                             DecorationBuiltIn);
          if ((bVar6 && pSVar12->storage == StorageClassOutput) && ((pSVar12->initializer).id != 0))
          {
            uVar8 = Compiler::get_decoration
                              ((Compiler *)this,(ID)(pSVar12->super_IVariant).self.id,
                               DecorationBuiltIn);
            puVar27 = &inner_factor_initializer_id;
            if (uVar8 != 0xc) {
              if (uVar8 != 0xb) goto LAB_002ddf47;
              puVar27 = &outer_factor_initializer_id;
            }
            *puVar27 = (pSVar12->initializer).id;
          }
        }
LAB_002ddf47:
        lVar29 = lVar29 + 4;
      } while (sVar2 << 2 != lVar29);
      uVar21 = (ulong)outer_factor_initializer_id;
      ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_190);
      if (((uVar21 != 0) &&
          (uVar21 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.buffer_size)) &&
         (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar21].type == TypeConstant))
      {
        pSVar19 = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar21);
        pSVar20 = Variant::get<spirv_cross::SPIRFunction>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
        local_180._8_8_ =
             ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:12772:9)>
             ::_M_invoke;
        local_180._0_8_ =
             ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:12772:9)>
             ::_M_manager;
        local_190._M_unused._M_object = this;
        local_190._8_8_ = pSVar19;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&pSVar20->fixup_hooks_in,(function<void_()> *)&local_190);
        if ((_func_int **)local_180._0_8_ != (_func_int **)0x0) {
          (*(code *)local_180._0_8_)(&local_190,&local_190,3);
        }
      }
    }
    paVar32 = &__str.field_2;
    uVar21 = (ulong)inner_factor_initializer_id;
    if (((uVar21 != 0) &&
        (uVar21 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                  super_VectorView<spirv_cross::Variant>.buffer_size)) &&
       (pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr, pVVar3[uVar21].type == TypeConstant)) {
      pSVar19 = Variant::get<spirv_cross::SPIRConstant>(pVVar3 + uVar21);
      pSVar20 = Variant::get<spirv_cross::SPIRFunction>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr +
                           (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
      bVar6 = Compiler::is_tessellating_triangles((Compiler *)this);
      local_190._8_8_ = pSVar19;
      if (bVar6) {
        local_180._8_8_ =
             ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:12788:42)>
             ::_M_invoke;
        local_180._0_8_ =
             ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:12788:42)>
             ::_M_manager;
        local_190._M_unused._M_object = this;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&pSVar20->fixup_hooks_in,(function<void_()> *)&local_190);
        if ((_func_int **)local_180._0_8_ != (_func_int **)0x0) {
          (*(code *)local_180._0_8_)(&local_190,&local_190,3);
        }
      }
      else {
        local_180._8_8_ =
             ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:12795:42)>
             ::_M_invoke;
        local_180._0_8_ =
             ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp:12795:42)>
             ::_M_manager;
        local_190._M_unused._M_object = this;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&pSVar20->fixup_hooks_in,(function<void_()> *)&local_190);
        if ((_func_int **)local_180._0_8_ != (_func_int **)0x0) {
          (*(code *)local_180._0_8_)(&local_190,&local_190,3);
        }
      }
    }
    if ((this->stage_in_var_id).id != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      if ((this->msl_options).multi_patch_workgroup == true) {
        pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id
                            );
        pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_180 + 0x10,this,pSVar13,0);
        uVar9 = (this->msl_options).shader_input_buffer_index;
        cVar7 = '\x01';
        if (9 < uVar9) {
          uVar28 = uVar9;
          cVar5 = '\x04';
          do {
            cVar7 = cVar5;
            if (uVar28 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_002de282;
            }
            if (uVar28 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_002de282;
            }
            if (uVar28 < 10000) goto LAB_002de282;
            bVar6 = 99999 < uVar28;
            uVar28 = uVar28 / 10000;
            cVar5 = cVar7 + '\x04';
          } while (bVar6);
          cVar7 = cVar7 + '\x01';
        }
LAB_002de282:
        __str._M_dataplus._M_p = (pointer)paVar32;
        ::std::__cxx11::string::_M_construct((ulong)&__str,cVar7);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar9);
        join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                  ((string *)&local_190,(spirv_cross *)0x377242,(char (*) [8])(local_180 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x360c1e,
                   (char (*) [3])&this->input_buffer_var_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3771ea,
                   (char (*) [11])&__str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                   in_stack_fffffffffffffe68);
        ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
        if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
          operator_delete(local_190._M_unused._M_object);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar32) {
          operator_delete(__str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._16_8_ == &local_160) goto LAB_002de3d4;
      }
      else {
        pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + (this->stage_in_var_id).id
                            );
        pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (local_180 + 0x10,this,pSVar13,0);
        uVar9 = (this->msl_options).shader_input_wg_index;
        cVar7 = '\x01';
        if (9 < uVar9) {
          uVar28 = uVar9;
          cVar5 = '\x04';
          do {
            cVar7 = cVar5;
            if (uVar28 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_002de32e;
            }
            if (uVar28 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_002de32e;
            }
            if (uVar28 < 10000) goto LAB_002de32e;
            bVar6 = 99999 < uVar28;
            uVar28 = uVar28 / 10000;
            cVar5 = cVar7 + '\x04';
          } while (bVar6);
          cVar7 = cVar7 + '\x01';
        }
LAB_002de32e:
        __str._M_dataplus._M_p = (pointer)paVar32;
        ::std::__cxx11::string::_M_construct((ulong)&__str,cVar7);
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar9);
        join<char_const(&)[13],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[16],std::__cxx11::string,char_const(&)[4]>
                  ((string *)&local_190,(spirv_cross *)"threadgroup ",
                   (char (*) [13])(local_180 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x360c1e,
                   (char (*) [3])&this->input_wg_var_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   " [[threadgroup(",(char (*) [16])&__str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                   in_stack_fffffffffffffe68);
        ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
        if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
          operator_delete(local_190._M_unused._M_object);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar32) {
          operator_delete(__str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._16_8_ == &local_160) goto LAB_002de3d4;
      }
      operator_delete((void *)local_180._16_8_);
    }
  }
LAB_002de3d4:
  EVar10 = Compiler::get_execution_model((Compiler *)this);
  if ((EVar10 == ExecutionModelTessellationEvaluation) &&
     ((this->msl_options).raw_buffer_tese_input == true)) {
    uVar9 = (this->patch_stage_in_var_id).id;
    if (uVar9 != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
        uVar9 = (this->patch_stage_in_var_id).id;
      }
      pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar9);
      pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_180 + 0x10,this,pSVar13,0);
      uVar9 = (this->msl_options).shader_patch_input_buffer_index;
      cVar7 = '\x01';
      if (9 < uVar9) {
        uVar28 = uVar9;
        cVar5 = '\x04';
        do {
          cVar7 = cVar5;
          if (uVar28 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_002de4aa;
          }
          if (uVar28 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_002de4aa;
          }
          if (uVar28 < 10000) goto LAB_002de4aa;
          bVar6 = 99999 < uVar28;
          uVar28 = uVar28 / 10000;
          cVar5 = cVar7 + '\x04';
        } while (bVar6);
        cVar7 = cVar7 + '\x01';
      }
LAB_002de4aa:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str,cVar7);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar9);
      join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((string *)&local_190,(spirv_cross *)"const device ",
                 (char (*) [14])(local_180 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x360c1e,
                 (char (*) [3])&this->patch_input_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3771ea,
                 (char (*) [11])&__str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                 in_stack_fffffffffffffe68);
      ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
      if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
        operator_delete(local_190._M_unused._M_object);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._16_8_ != &local_160) {
        operator_delete((void *)local_180._16_8_);
      }
    }
    if ((this->tess_level_outer_var_id).id != 0 || (this->tess_level_inner_var_id).id != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
      }
      get_tess_factor_struct_name_abi_cxx11_((string *)(local_180 + 0x10),this);
      uVar9 = (this->msl_options).shader_tess_factor_buffer_index;
      cVar7 = '\x01';
      if (9 < uVar9) {
        uVar28 = uVar9;
        cVar5 = '\x04';
        do {
          cVar7 = cVar5;
          if (uVar28 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_002de5e1;
          }
          if (uVar28 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_002de5e1;
          }
          if (uVar28 < 10000) goto LAB_002de5e1;
          bVar6 = 99999 < uVar28;
          uVar28 = uVar28 / 10000;
          cVar5 = cVar7 + '\x04';
        } while (bVar6);
        cVar7 = cVar7 + '\x01';
      }
LAB_002de5e1:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str,cVar7);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar9);
      join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((string *)&local_190,(spirv_cross *)"const device ",
                 (char (*) [14])(local_180 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x360c1e,
                 (char (*) [3])&this->tess_factor_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3771ea,
                 (char (*) [11])&__str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                 in_stack_fffffffffffffe68);
      ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
      if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
        operator_delete(local_190._M_unused._M_object);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._16_8_ != &local_160) {
        operator_delete((void *)local_180._16_8_);
      }
    }
    uVar9 = (this->stage_in_var_id).id;
    if (uVar9 != 0) {
      if (ep_args->_M_string_length != 0) {
        ::std::__cxx11::string::append((char *)ep_args);
        uVar9 = (this->stage_in_var_id).id;
      }
      pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar9);
      pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                (local_180 + 0x10,this,pSVar13,0);
      uVar9 = (this->msl_options).shader_input_buffer_index;
      cVar7 = '\x01';
      if (9 < uVar9) {
        uVar28 = uVar9;
        cVar5 = '\x04';
        do {
          cVar7 = cVar5;
          if (uVar28 < 100) {
            cVar7 = cVar7 + -2;
            goto LAB_002de742;
          }
          if (uVar28 < 1000) {
            cVar7 = cVar7 + -1;
            goto LAB_002de742;
          }
          if (uVar28 < 10000) goto LAB_002de742;
          bVar6 = 99999 < uVar28;
          uVar28 = uVar28 / 10000;
          cVar5 = cVar7 + '\x04';
        } while (bVar6);
        cVar7 = cVar7 + '\x01';
      }
LAB_002de742:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str,cVar7);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar9);
      join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[11],std::__cxx11::string,char_const(&)[4]>
                ((string *)&local_190,(spirv_cross *)"const device ",
                 (char (*) [14])(local_180 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x360c1e,
                 (char (*) [3])&this->input_buffer_var_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3771ea,
                 (char (*) [11])&__str,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)")]]",
                 in_stack_fffffffffffffe68);
      ::std::__cxx11::string::_M_append((char *)ep_args,local_190._M_unused._M_member_pointer);
      if ((CompilerMSL *)local_190._M_unused._0_8_ != (CompilerMSL *)local_180) {
        operator_delete(local_190._M_unused._M_object);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._16_8_ != &local_160) {
        operator_delete((void *)local_180._16_8_);
      }
    }
  }
  active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.
  buffer_size = 0;
  if (active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.ptr !=
      (pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn> *)&active_builtins.stack_storage) {
    free(active_builtins.super_VectorView<std::pair<spirv_cross::SPIRVariable_*,_spv::BuiltIn>_>.ptr
        );
  }
  return;
}

Assistant:

void CompilerMSL::entry_point_args_builtin(string &ep_args)
{
	// Builtin variables
	SmallVector<pair<SPIRVariable *, BuiltIn>, 8> active_builtins;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t var_id, SPIRVariable &var) {
		if (var.storage != StorageClassInput)
			return;

		auto bi_type = BuiltIn(get_decoration(var_id, DecorationBuiltIn));

		// Don't emit SamplePosition as a separate parameter. In the entry
		// point, we get that by calling get_sample_position() on the sample ID.
		if (is_builtin_variable(var) &&
		    get_variable_data_type(var).basetype != SPIRType::Struct &&
		    get_variable_data_type(var).basetype != SPIRType::ControlPointArray)
		{
			// If the builtin is not part of the active input builtin set, don't emit it.
			// Relevant for multiple entry-point modules which might declare unused builtins.
			if (!active_input_builtins.get(bi_type) || !interface_variable_exists_in_entry_point(var_id))
				return;

			// Remember this variable. We may need to correct its type.
			active_builtins.push_back(make_pair(&var, bi_type));

			if (is_direct_input_builtin(bi_type))
			{
				if (!ep_args.empty())
					ep_args += ", ";

				// Handle HLSL-style 0-based vertex/instance index.
				builtin_declaration = true;

				// Handle different MSL gl_TessCoord types. (float2, float3)
				if (bi_type == BuiltInTessCoord && get_entry_point().flags.get(ExecutionModeQuads))
					ep_args += "float2 " + to_expression(var_id) + "In";
				else
					ep_args += builtin_type_decl(bi_type, var_id) + " " + to_expression(var_id);

				ep_args += " [[" + builtin_qualifier(bi_type);
				if (bi_type == BuiltInSampleMask && get_entry_point().flags.get(ExecutionModePostDepthCoverage))
				{
					if (!msl_options.supports_msl_version(2))
						SPIRV_CROSS_THROW("Post-depth coverage requires MSL 2.0.");
					if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 3))
						SPIRV_CROSS_THROW("Post-depth coverage on Mac requires MSL 2.3.");
					ep_args += ", post_depth_coverage";
				}
				ep_args += "]]";
				builtin_declaration = false;
			}
		}

		if (has_extended_decoration(var_id, SPIRVCrossDecorationBuiltInDispatchBase))
		{
			// This is a special implicit builtin, not corresponding to any SPIR-V builtin,
			// which holds the base that was passed to vkCmdDispatchBase() or vkCmdDrawIndexed(). If it's present,
			// assume we emitted it for a good reason.
			assert(msl_options.supports_msl_version(1, 2));
			if (!ep_args.empty())
				ep_args += ", ";

			ep_args += type_to_glsl(get_variable_data_type(var)) + " " + to_expression(var_id) + " [[grid_origin]]";
		}

		if (has_extended_decoration(var_id, SPIRVCrossDecorationBuiltInStageInputSize))
		{
			// This is another special implicit builtin, not corresponding to any SPIR-V builtin,
			// which holds the number of vertices and instances to draw. If it's present,
			// assume we emitted it for a good reason.
			assert(msl_options.supports_msl_version(1, 2));
			if (!ep_args.empty())
				ep_args += ", ";

			ep_args += type_to_glsl(get_variable_data_type(var)) + " " + to_expression(var_id) + " [[grid_size]]";
		}
	});

	// Correct the types of all encountered active builtins. We couldn't do this before
	// because ensure_correct_builtin_type() may increase the bound, which isn't allowed
	// while iterating over IDs.
	for (auto &var : active_builtins)
		var.first->basetype = ensure_correct_builtin_type(var.first->basetype, var.second);

	// Handle HLSL-style 0-based vertex/instance index.
	if (needs_base_vertex_arg == TriState::Yes)
		ep_args += built_in_func_arg(BuiltInBaseVertex, !ep_args.empty());

	if (needs_base_instance_arg == TriState::Yes)
		ep_args += built_in_func_arg(BuiltInBaseInstance, !ep_args.empty());

	if (capture_output_to_buffer)
	{
		// Add parameters to hold the indirect draw parameters and the shader output. This has to be handled
		// specially because it needs to be a pointer, not a reference.
		if (stage_out_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("device ", type_to_glsl(get_stage_out_struct_type()), "* ", output_buffer_var_name,
			                " [[buffer(", msl_options.shader_output_buffer_index, ")]]");
		}

		if (is_tesc_shader())
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args +=
			    join("constant uint* spvIndirectParams [[buffer(", msl_options.indirect_params_buffer_index, ")]]");
		}
		else if (stage_out_var_id &&
		         !(get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation))
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args +=
			    join("device uint* spvIndirectParams [[buffer(", msl_options.indirect_params_buffer_index, ")]]");
		}

		if (get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation &&
		    (active_input_builtins.get(BuiltInVertexIndex) || active_input_builtins.get(BuiltInVertexId)) &&
		    msl_options.vertex_index_type != Options::IndexType::None)
		{
			// Add the index buffer so we can set gl_VertexIndex correctly.
			if (!ep_args.empty())
				ep_args += ", ";
			switch (msl_options.vertex_index_type)
			{
			case Options::IndexType::None:
				break;
			case Options::IndexType::UInt16:
				ep_args += join("const device ushort* ", index_buffer_var_name, " [[buffer(",
				                msl_options.shader_index_buffer_index, ")]]");
				break;
			case Options::IndexType::UInt32:
				ep_args += join("const device uint* ", index_buffer_var_name, " [[buffer(",
				                msl_options.shader_index_buffer_index, ")]]");
				break;
			}
		}

		// Tessellation control shaders get three additional parameters:
		// a buffer to hold the per-patch data, a buffer to hold the per-patch
		// tessellation levels, and a block of workgroup memory to hold the
		// input control point data.
		if (is_tesc_shader())
		{
			if (patch_stage_out_var_id)
			{
				if (!ep_args.empty())
					ep_args += ", ";
				ep_args +=
				    join("device ", type_to_glsl(get_patch_stage_out_struct_type()), "* ", patch_output_buffer_var_name,
				         " [[buffer(", convert_to_string(msl_options.shader_patch_output_buffer_index), ")]]");
			}
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("device ", get_tess_factor_struct_name(), "* ", tess_factor_buffer_var_name, " [[buffer(",
			                convert_to_string(msl_options.shader_tess_factor_buffer_index), ")]]");

			// Initializer for tess factors must be handled specially since it's never declared as a normal variable.
			uint32_t outer_factor_initializer_id = 0;
			uint32_t inner_factor_initializer_id = 0;
			ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
				if (!has_decoration(var.self, DecorationBuiltIn) || var.storage != StorageClassOutput || !var.initializer)
					return;

				BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
				if (builtin == BuiltInTessLevelInner)
					inner_factor_initializer_id = var.initializer;
				else if (builtin == BuiltInTessLevelOuter)
					outer_factor_initializer_id = var.initializer;
			});

			const SPIRConstant *c = nullptr;

			if (outer_factor_initializer_id && (c = maybe_get<SPIRConstant>(outer_factor_initializer_id)))
			{
				auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
				entry_func.fixup_hooks_in.push_back(
				    [=]()
				    {
					    uint32_t components = is_tessellating_triangles() ? 3 : 4;
					    for (uint32_t i = 0; i < components; i++)
					    {
						    statement(builtin_to_glsl(BuiltInTessLevelOuter, StorageClassOutput), "[", i,
						              "] = ", "half(", to_expression(c->subconstants[i]), ");");
					    }
				    });
			}

			if (inner_factor_initializer_id && (c = maybe_get<SPIRConstant>(inner_factor_initializer_id)))
			{
				auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
				if (is_tessellating_triangles())
				{
					entry_func.fixup_hooks_in.push_back([=]() {
						statement(builtin_to_glsl(BuiltInTessLevelInner, StorageClassOutput), " = ", "half(",
						          to_expression(c->subconstants[0]), ");");
					});
				}
				else
				{
					entry_func.fixup_hooks_in.push_back([=]() {
						for (uint32_t i = 0; i < 2; i++)
						{
							statement(builtin_to_glsl(BuiltInTessLevelInner, StorageClassOutput), "[", i, "] = ",
							          "half(", to_expression(c->subconstants[i]), ");");
						}
					});
				}
			}

			if (stage_in_var_id)
			{
				if (!ep_args.empty())
					ep_args += ", ";
				if (msl_options.multi_patch_workgroup)
				{
					ep_args += join("device ", type_to_glsl(get_stage_in_struct_type()), "* ", input_buffer_var_name,
					                " [[buffer(", convert_to_string(msl_options.shader_input_buffer_index), ")]]");
				}
				else
				{
					ep_args += join("threadgroup ", type_to_glsl(get_stage_in_struct_type()), "* ", input_wg_var_name,
					                " [[threadgroup(", convert_to_string(msl_options.shader_input_wg_index), ")]]");
				}
			}
		}
	}
	// Tessellation evaluation shaders get three additional parameters:
	// a buffer for the per-patch data, a buffer for the per-patch
	// tessellation levels, and a buffer for the control point data.
	if (is_tese_shader() && msl_options.raw_buffer_tese_input)
	{
		if (patch_stage_in_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args +=
			    join("const device ", type_to_glsl(get_patch_stage_in_struct_type()), "* ", patch_input_buffer_var_name,
			         " [[buffer(", convert_to_string(msl_options.shader_patch_input_buffer_index), ")]]");
		}

		if (tess_level_inner_var_id || tess_level_outer_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("const device ", get_tess_factor_struct_name(), "* ", tess_factor_buffer_var_name,
			                " [[buffer(", convert_to_string(msl_options.shader_tess_factor_buffer_index), ")]]");
		}

		if (stage_in_var_id)
		{
			if (!ep_args.empty())
				ep_args += ", ";
			ep_args += join("const device ", type_to_glsl(get_stage_in_struct_type()), "* ", input_buffer_var_name,
			                " [[buffer(", convert_to_string(msl_options.shader_input_buffer_index), ")]]");
		}
	}
}